

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::SetCTestConfigurationFromCMakeVariable
          (cmCTest *this,cmMakefile *mf,char *dconfig,string *cmake_var,bool suppress)

{
  bool bVar1;
  ostream *poVar2;
  char *msg;
  string *value;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream cmCTestLog_msg;
  cmValue local_40;
  cmValue ctvar;
  bool suppress_local;
  string *cmake_var_local;
  char *dconfig_local;
  cmMakefile *mf_local;
  cmCTest *this_local;
  
  ctvar.Value._7_1_ = suppress;
  local_40 = cmMakefile::GetDefinition(mf,cmake_var);
  bVar1 = cmValue::operator_cast_to_bool(&local_40);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar2 = std::operator<<((ostream *)local_1b8,"SetCTestConfigurationFromCMakeVariable:");
    poVar2 = std::operator<<(poVar2,dconfig);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::operator<<(poVar2,(string *)cmake_var);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xd68,msg,(bool)(ctvar.Value._7_1_ & 1));
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    value = cmValue::operator*[abi_cxx11_(&local_40);
    SetCTestConfiguration(this,dconfig,value,(bool)(ctvar.Value._7_1_ & 1));
  }
  return bVar1;
}

Assistant:

bool cmCTest::SetCTestConfigurationFromCMakeVariable(
  cmMakefile* mf, const char* dconfig, const std::string& cmake_var,
  bool suppress)
{
  cmValue ctvar = mf->GetDefinition(cmake_var);
  if (!ctvar) {
    return false;
  }
  cmCTestOptionalLog(this, HANDLER_VERBOSE_OUTPUT,
                     "SetCTestConfigurationFromCMakeVariable:"
                       << dconfig << ":" << cmake_var << std::endl,
                     suppress);
  this->SetCTestConfiguration(dconfig, *ctvar, suppress);
  return true;
}